

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

matrix3d * tinyusdz::to_matrix3x3(matrix3d *__return_storage_ptr__,quatd *q)

{
  long lVar1;
  mat<double,_3,_3> *pmVar2;
  matrix3d *pmVar3;
  byte bVar4;
  vec<double,_4> local_78;
  double3x3 m33;
  
  bVar4 = 0;
  local_78.x = (q->imag)._M_elems[0];
  local_78.y = (q->imag)._M_elems[1];
  local_78.z = (q->imag)._M_elems[2];
  local_78.w = q->real;
  linalg::qmat<double>(&m33,&local_78);
  __return_storage_ptr__->m[0][0] = 1.0;
  __return_storage_ptr__->m[1][0] = 0.0;
  __return_storage_ptr__->m[0][1] = 0.0;
  __return_storage_ptr__->m[0][2] = 0.0;
  __return_storage_ptr__->m[1][1] = 1.0;
  __return_storage_ptr__->m[1][2] = 0.0;
  __return_storage_ptr__->m[2][0] = 0.0;
  __return_storage_ptr__->m[2][1] = 0.0;
  __return_storage_ptr__->m[2][2] = 1.0;
  Identity(__return_storage_ptr__);
  pmVar2 = &m33;
  pmVar3 = __return_storage_ptr__;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    pmVar3->m[0][0] = (pmVar2->x).x;
    pmVar2 = (mat<double,_3,_3> *)((long)pmVar2 + (ulong)bVar4 * -0x10 + 8);
    pmVar3 = (matrix3d *)((long)pmVar3 + ((ulong)bVar4 * -2 + 1) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

value::matrix3d to_matrix3x3(const value::quatd &q) {
  double3x3 m33 =
      linalg::qmat<double>({q.imag[0], q.imag[1], q.imag[2], q.real});

  value::matrix3d m;
  Identity(&m);

  memcpy(m.m, &m33[0][0], sizeof(double) * 3 * 3);

  return m;
}